

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

size_t zt_cstr_copy(char *from,ssize_t i,ssize_t j,char *to,size_t len)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong __n;
  
  sVar1 = strlen(from);
  if (sVar1 == 0) {
    lVar4 = 0;
    lVar3 = 0;
  }
  else {
    if (i < 0) {
      lVar2 = sVar1 - 1;
      if ((long)(i + sVar1) < (long)sVar1) {
        lVar2 = i + sVar1;
      }
    }
    else {
      lVar2 = sVar1 - 1;
      if (i < (long)sVar1) {
        lVar2 = i;
      }
    }
    if (j < 0) {
      lVar3 = sVar1 - 1;
      if ((long)(j + sVar1) < (long)sVar1) {
        lVar3 = j + sVar1;
      }
    }
    else {
      lVar3 = sVar1 - 1;
      if (j < (long)sVar1) {
        lVar3 = j;
      }
    }
    lVar4 = lVar3;
    if (lVar3 < lVar2) {
      lVar4 = lVar2;
    }
    if (lVar2 < lVar3) {
      lVar3 = lVar2;
    }
  }
  lVar4 = lVar3 - lVar4;
  lVar2 = -lVar4;
  if (0 < lVar4) {
    lVar2 = lVar4;
  }
  __n = lVar2 + 1U;
  if (len <= lVar2 + 1U) {
    __n = len;
  }
  memcpy(to,from + lVar3,__n);
  return __n;
}

Assistant:

size_t
zt_cstr_copy(const char * from, ssize_t i, ssize_t j, char * to, size_t len) {
    size_t    flen;
    ssize_t    min;

    CONVERT(from, i, j);
    flen = IDXLEN(i, j);

    min  = MIN(flen, len);
    memcpy(to, &from[i], min);
    return min;
}